

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::GpuCounterDescriptor_GpuCounterSpec::ParseFromArray
          (GpuCounterDescriptor_GpuCounterSpec *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pGVar2;
  pointer pGVar3;
  undefined1 uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  ulong *puVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong *puVar18;
  string *psVar19;
  ulong *puVar20;
  uint *puVar21;
  bool bVar22;
  Field local_88;
  ulong *local_78;
  string *local_70;
  ulong *local_68;
  GpuCounterDescriptor_GpuCounterSpec *local_60;
  vector<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
  *local_58;
  vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  *local_50;
  vector<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
  *local_48;
  string *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pGVar2 = (this->numerator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->numerator_units_).
      super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
      ._M_impl.super__Vector_impl_data._M_finish != pGVar2) {
    (this->numerator_units_).
    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
    ._M_impl.super__Vector_impl_data._M_finish = pGVar2;
  }
  pGVar2 = (this->denominator_units_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->denominator_units_).
      super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
      ._M_impl.super__Vector_impl_data._M_finish != pGVar2) {
    (this->denominator_units_).
    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_MeasureUnit>_>
    ._M_impl.super__Vector_impl_data._M_finish = pGVar2;
  }
  pGVar3 = (this->groups_).
           super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->groups_).
      super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish != pGVar3) {
    (this->groups_).
    super__Vector_base<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup,_std::allocator<perfetto::protos::gen::GpuCounterDescriptor_GpuCounterGroup>_>
    ._M_impl.super__Vector_impl_data._M_finish = pGVar3;
  }
  local_48 = &this->numerator_units_;
  local_50 = &this->denominator_units_;
  local_58 = &this->groups_;
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar20 = (ulong *)(size + (long)raw);
  do {
    lVar10 = 7;
    if (puVar20 <= raw) goto LAB_0022f607;
    uVar14 = (ulong)(char)(byte)*raw;
    puVar13 = (ulong *)((long)raw + 1);
    if ((long)uVar14 < 0) {
      bVar1 = (byte)*raw;
      uVar6 = (ulong)(bVar1 & 0x7f);
      bVar11 = false;
      puVar15 = puVar13;
      for (lVar9 = lVar10;
          (puVar12 = puVar15, uVar14 = uVar6, (char)bVar1 < '\0' &&
          (bVar22 = 0x38 < lVar9 - 7U, bVar11 = bVar22 || puVar20 <= puVar15, size = (size_t)puVar15
          , puVar12 = puVar13, uVar14 = 0, !bVar22 && puVar20 > puVar15)); lVar9 = lVar9 + 7) {
        bVar1 = (byte)*puVar15;
        puVar15 = (ulong *)((long)puVar15 + 1);
        uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar9 & 0x3f);
        size = (size_t)puVar15;
      }
      puVar13 = puVar12;
      if (bVar11) {
        puVar13 = (ulong *)raw;
        uVar14 = 0;
      }
      if (puVar13 == (ulong *)raw) goto LAB_0022f607;
    }
    uVar5 = (uint)(uVar14 >> 3);
    if ((uVar5 == 0) || (puVar20 <= puVar13)) {
switchD_0022f47e_caseD_3:
      bVar11 = false;
      uVar14 = 0;
      local_88.int_value_ = (uint64_t)(ulong *)0x0;
    }
    else {
      switch((uint)uVar14 & 7) {
      case 0:
        puVar16 = (ulong *)0x0;
        bVar11 = puVar13 >= puVar20;
        if (puVar13 < puVar20) {
          size = (long)puVar13 + 1;
          puVar15 = (ulong *)(ulong)((byte)*puVar13 & 0x7f);
          puVar12 = puVar15;
          uVar7 = 0;
          if ((char)(byte)*puVar13 < '\0') {
            puVar12 = (ulong *)0x0;
            uVar7 = 0;
            lVar10 = 7;
            puVar18 = (ulong *)size;
            do {
              bVar22 = 0x38 < lVar10 - 7U;
              bVar11 = bVar22 || puVar20 <= puVar18;
              if (bVar22 || puVar20 <= puVar18) goto LAB_0022f60e;
              uVar6 = *puVar18;
              puVar18 = (ulong *)((long)puVar18 + 1);
              puVar15 = (ulong *)((ulong)puVar15 |
                                 (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar10 & 0x3f));
              lVar10 = lVar10 + 7;
            } while ((char)(byte)uVar6 < '\0');
            puVar12 = (ulong *)((ulong)puVar15 & 0xffffffff);
            size = (size_t)puVar18;
            uVar7 = (uint)((ulong)puVar15 >> 0x20);
          }
        }
        else {
          puVar12 = (ulong *)0x0;
          uVar7 = 0;
        }
LAB_0022f60e:
        puVar15 = (ulong *)(ulong)uVar7;
        if (bVar11) {
          size = (size_t)puVar13;
          puVar15 = puVar16;
          puVar12 = puVar16;
        }
        local_78 = puVar13;
        local_68 = (ulong *)raw;
        if ((ulong *)size != puVar13) goto LAB_0022f635;
        uVar14 = 0;
        bVar11 = false;
        local_88.int_value_ = (uint64_t)puVar16;
        goto LAB_0022f677;
      case 1:
        size = (size_t)(puVar13 + 1);
        if (puVar20 < size) {
LAB_0022f607:
          uVar14 = 0;
          bVar11 = false;
          local_88.int_value_ = (uint64_t)(ulong *)0x0;
          goto LAB_0022f677;
        }
        puVar12 = (ulong *)*puVar13;
        puVar15 = (ulong *)((ulong)puVar12 >> 0x20);
        break;
      case 2:
        bVar11 = puVar13 >= puVar20;
        psVar19 = local_70;
        if (puVar13 < puVar20) {
          bVar1 = (byte)*puVar13;
          puVar12 = (ulong *)(ulong)(bVar1 & 0x7f);
          puVar15 = (ulong *)((long)puVar13 + 1U);
          for (; (size = (size_t)puVar15, psVar19 = (string *)puVar12, (char)bVar1 < '\0' &&
                 (bVar22 = 0x38 < lVar10 - 7U, bVar11 = bVar22 || puVar20 <= puVar15,
                 size = (size_t)((long)puVar13 + 1U), psVar19 = local_70,
                 !bVar22 && puVar20 > puVar15)); lVar10 = lVar10 + 7) {
            bVar1 = (byte)*puVar15;
            puVar15 = (ulong *)((long)puVar15 + 1);
            puVar12 = (ulong *)((ulong)puVar12 | (ulong)(bVar1 & 0x7f) << ((byte)lVar10 & 0x3f));
          }
        }
        local_70 = psVar19;
        if (bVar11) {
          size = (size_t)puVar13;
          local_70 = (string *)(ulong *)0x0;
        }
        if (((ulong *)size == puVar13) || ((ulong *)((long)puVar20 - size) < local_70)) {
          puVar15 = (ulong *)0x0;
          puVar12 = (ulong *)0x0;
          bVar11 = false;
          puVar16 = (ulong *)0x0;
        }
        else {
          puVar15 = (ulong *)(size >> 0x20);
          puVar12 = (ulong *)(size & 0xffffffff);
          size = size + (long)local_70;
          bVar11 = true;
          puVar16 = (ulong *)local_70;
        }
        local_78 = puVar13;
        if (!bVar11) goto LAB_0022f607;
        goto LAB_0022f635;
      default:
        goto switchD_0022f47e_caseD_3;
      case 5:
        size = (long)puVar13 + 4;
        puVar15 = (ulong *)0x0;
        if (puVar20 < size) goto LAB_0022f607;
        puVar12 = (ulong *)(ulong)(uint)*puVar13;
      }
      puVar16 = (ulong *)0x0;
LAB_0022f635:
      bVar11 = true;
      raw = (void *)size;
      if ((uVar5 < 0x10000) && (puVar16 < (ulong *)0x10000000)) {
        local_88.int_value_ = (ulong)puVar12 & 0xffffffff | (long)puVar15 << 0x20;
        uVar14 = (ulong)puVar16 | (uVar14 >> 3) << 0x20 | (ulong)((uint)uVar14 & 7) << 0x30;
        bVar11 = false;
      }
      else {
        local_88.int_value_ = 0;
        uVar14 = 0;
      }
    }
LAB_0022f677:
    puVar21 = &switchD_0022f47e::switchdataD_0034d274;
    if (!bVar11) {
      local_88.size_ = (uint32_t)uVar14;
      local_88.type_ = (uint8_t)(uVar14 >> 0x30);
      local_88.id_ = (uint16_t)(uVar14 >> 0x20);
      if (local_88.id_ != 0) {
        local_70 = &this->description_;
        local_40 = &this->name_;
        local_60 = this;
        do {
          if ((ushort)(uVar14 >> 0x20) < 0xb) {
            (this->_has_field_).super__Base_bitset<1UL>._M_w =
                 (this->_has_field_).super__Base_bitset<1UL>._M_w |
                 1L << ((byte)(uVar14 >> 0x20) & 0x3f);
          }
          uVar5 = ((uint)(uVar14 >> 0x20) & 0xffff) - 1;
          if (uVar5 < 10) {
            uVar4 = (*(code *)(&DAT_0034d28c + *(int *)(&DAT_0034d28c + (ulong)uVar5 * 4)))();
            return (bool)uVar4;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_88,local_38);
          do {
            if (puVar20 <= raw) goto LAB_0022f920;
            uVar14 = (ulong)(char)(byte)*raw;
            puVar13 = (ulong *)((long)raw + 1);
            if ((long)uVar14 < 0) {
              uVar6 = (ulong)((byte)*raw & 0x7f);
              bVar11 = false;
              uVar14 = uVar6;
              puVar15 = puVar13;
              if ((char)(byte)*raw < '\0') {
                lVar10 = 7;
                puVar12 = puVar13;
                do {
                  bVar11 = 0x38 < lVar10 - 7U || puVar20 <= puVar12;
                  uVar14 = 0;
                  puVar15 = puVar13;
                  if (bVar11) break;
                  uVar17 = *puVar12;
                  puVar15 = (ulong *)((long)puVar12 + 1);
                  uVar6 = uVar6 | (ulong)((byte)uVar17 & 0x7f) << ((byte)lVar10 & 0x3f);
                  lVar10 = lVar10 + 7;
                  uVar14 = uVar6;
                  puVar12 = puVar15;
                } while ((char)(byte)uVar17 < '\0');
              }
              puVar13 = puVar15;
              if (bVar11) {
                puVar13 = (ulong *)raw;
                uVar14 = 0;
              }
              if (puVar13 == (ulong *)raw) goto LAB_0022f920;
            }
            uVar5 = (uint)(uVar14 >> 3);
            if ((uVar5 == 0) || (puVar20 <= puVar13)) {
switchD_0022f9a8_caseD_3:
              bVar11 = false;
              uVar14 = 0;
              local_88.int_value_ = (uint64_t)(ulong *)0x0;
              goto LAB_0022fba9;
            }
            switch((uint)uVar14 & 7) {
            case 0:
              puVar12 = (ulong *)0x0;
              bVar11 = puVar13 >= puVar20;
              if (puVar13 < puVar20) {
                puVar15 = (ulong *)((long)puVar13 + 1);
                bVar1 = (byte)*puVar13;
                uVar17 = (ulong)(bVar1 & 0x7f);
                uVar6 = uVar17;
                if ((char)bVar1 < '\0') {
                  uVar6 = 0;
                }
                uVar7 = (uint)uVar6;
                puVar21 = (uint *)puVar15;
                uVar8 = 0;
                if ((char)bVar1 < '\0') {
                  lVar10 = 7;
                  puVar16 = puVar15;
                  do {
                    uVar7 = (uint)uVar6;
                    bVar11 = 0x38 < lVar10 - 7U || puVar20 <= puVar16;
                    puVar21 = (uint *)puVar15;
                    uVar8 = 0;
                    if (bVar11) break;
                    bVar1 = (byte)*puVar16;
                    puVar16 = (ulong *)((long)puVar16 + 1);
                    uVar17 = uVar17 | (ulong)(bVar1 & 0x7f) << ((byte)lVar10 & 0x3f);
                    lVar10 = lVar10 + 7;
                    if (-1 < (char)bVar1) {
                      uVar6 = uVar17 & 0xffffffff;
                    }
                    uVar7 = (uint)uVar6;
                    uVar8 = (uint)(uVar17 >> 0x20);
                    puVar21 = (uint *)puVar16;
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                uVar7 = 0;
                uVar8 = 0;
              }
              if (bVar11) {
                uVar7 = 0;
              }
              puVar15 = (ulong *)(ulong)uVar8;
              if (bVar11) {
                puVar21 = (uint *)puVar13;
                puVar15 = puVar12;
              }
              this = local_60;
              local_68 = (ulong *)raw;
              if ((ulong *)puVar21 == puVar13) {
                uVar14 = 0;
                bVar11 = false;
                local_88.int_value_ = (uint64_t)puVar12;
              }
              else {
LAB_0022fb62:
                raw = puVar21;
                bVar11 = true;
                puVar21 = (uint *)raw;
                if ((uVar5 < 0x10000) && (puVar12 < (ulong *)0x10000000)) {
                  local_88.int_value_ = (ulong)uVar7 | (long)puVar15 << 0x20;
                  uVar14 = (ulong)puVar12 | (uVar14 >> 3) << 0x20 | (uVar14 & 7) << 0x30;
                  bVar11 = false;
                }
                else {
                  local_88.int_value_ = 0;
                  uVar14 = 0;
                }
              }
              break;
            case 1:
              puVar21 = (uint *)(puVar13 + 1);
              if (puVar21 <= puVar20) {
                uVar6 = *puVar13;
                puVar15 = (ulong *)(uVar6 >> 0x20);
LAB_0022fa0b:
                uVar7 = (uint)uVar6;
                puVar12 = (ulong *)0x0;
                goto LAB_0022fb62;
              }
              goto LAB_0022f920;
            case 2:
              bVar11 = puVar13 >= puVar20;
              puVar15 = local_78;
              if (puVar13 < puVar20) {
                puVar12 = (ulong *)((long)puVar13 + 1);
                puVar16 = (ulong *)(ulong)((byte)*puVar13 & 0x7f);
                puVar15 = puVar16;
                puVar21 = (uint *)puVar12;
                if ((char)(byte)*puVar13 < '\0') {
                  lVar10 = 7;
                  puVar18 = puVar12;
                  do {
                    bVar11 = 0x38 < lVar10 - 7U || puVar20 <= puVar18;
                    puVar15 = local_78;
                    puVar21 = (uint *)puVar12;
                    if (bVar11) break;
                    uVar6 = *puVar18;
                    puVar18 = (ulong *)((long)puVar18 + 1);
                    puVar16 = (ulong *)((ulong)puVar16 |
                                       (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar10 & 0x3f));
                    lVar10 = lVar10 + 7;
                    puVar15 = puVar16;
                    puVar21 = (uint *)puVar18;
                  } while ((char)(byte)uVar6 < '\0');
                }
              }
              local_78 = puVar15;
              if (bVar11) {
                puVar21 = (uint *)puVar13;
                local_78 = (ulong *)0x0;
              }
              if (((ulong *)puVar21 == puVar13) ||
                 ((ulong *)((long)puVar20 - (long)puVar21) < local_78)) {
                uVar7 = 0;
                puVar15 = (ulong *)0x0;
                bVar11 = false;
                puVar12 = (ulong *)0x0;
              }
              else {
                puVar15 = (ulong *)((ulong)puVar21 >> 0x20);
                uVar7 = (uint)puVar21;
                puVar21 = (uint *)((long)puVar21 + (long)local_78);
                bVar11 = true;
                puVar12 = local_78;
              }
              if (bVar11) goto LAB_0022fb62;
              uVar14 = 0;
              bVar11 = false;
              local_88.int_value_ = (uint64_t)(ulong *)0x0;
              break;
            default:
              goto switchD_0022f9a8_caseD_3;
            case 5:
              puVar21 = (uint *)((long)puVar13 + 4);
              puVar15 = (ulong *)0x0;
              if (puVar21 <= puVar20) {
                uVar6 = (ulong)(uint)*puVar13;
                goto LAB_0022fa0b;
              }
LAB_0022f920:
              uVar14 = 0;
              bVar11 = false;
              local_88.int_value_ = (uint64_t)(ulong *)0x0;
            }
LAB_0022fba9:
          } while (bVar11);
          local_88.size_ = (uint32_t)uVar14;
          local_88.type_ = (uint8_t)(uVar14 >> 0x30);
          local_88.id_ = (uint16_t)(uVar14 >> 0x20);
        } while (local_88.id_ != 0);
      }
      return puVar20 == (ulong *)raw;
    }
  } while( true );
}

Assistant:

bool GpuCounterDescriptor_GpuCounterSpec::ParseFromArray(const void* raw, size_t size) {
  numerator_units_.clear();
  denominator_units_.clear();
  groups_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* counter_id */:
        field.get(&counter_id_);
        break;
      case 2 /* name */:
        field.get(&name_);
        break;
      case 3 /* description */:
        field.get(&description_);
        break;
      case 5 /* int_peak_value */:
        field.get(&int_peak_value_);
        break;
      case 6 /* double_peak_value */:
        field.get(&double_peak_value_);
        break;
      case 7 /* numerator_units */:
        numerator_units_.emplace_back();
        field.get(&numerator_units_.back());
        break;
      case 8 /* denominator_units */:
        denominator_units_.emplace_back();
        field.get(&denominator_units_.back());
        break;
      case 9 /* select_by_default */:
        field.get(&select_by_default_);
        break;
      case 10 /* groups */:
        groups_.emplace_back();
        field.get(&groups_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}